

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::OpenPopupOnItemClick(char *str_id,ImGuiMouseButton mouse_button)

{
  bool bVar1;
  char *in_RDI;
  ImGuiID id;
  ImGuiWindow *unaff_retaddr;
  ImGuiWindow *window;
  ImGuiID in_stack_00000034;
  ImGuiID local_28;
  ImGuiWindow *pIVar2;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  pIVar2 = GImGui->CurrentWindow;
  bVar1 = IsMouseReleased((ImGuiMouseButton)((ulong)pIVar2 >> 0x20));
  if ((bVar1) && (bVar1 = IsItemHovered((ImGuiHoveredFlags)pIVar2), bVar1)) {
    if (in_RDI == (char *)0x0) {
      local_28 = (pIVar2->DC).LastItemId;
    }
    else {
      local_28 = ImGuiWindow::GetID(unaff_retaddr,
                                    (char *)CONCAT17(in_stack_ffffffffffffffff,
                                                     in_stack_fffffffffffffff8),in_RDI);
    }
    if (local_28 == 0) {
      __assert_fail("id != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                    ,0x1ea5,"bool ImGui::OpenPopupOnItemClick(const char *, ImGuiMouseButton)");
    }
    OpenPopupEx(in_stack_00000034);
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ImGui::OpenPopupOnItemClick(const char* str_id, ImGuiMouseButton mouse_button)
{
    ImGuiWindow* window = GImGui->CurrentWindow;
    if (IsMouseReleased(mouse_button) && IsItemHovered(ImGuiHoveredFlags_AllowWhenBlockedByPopup))
    {
        ImGuiID id = str_id ? window->GetID(str_id) : window->DC.LastItemId; // If user hasn't passed an ID, we can use the LastItemID. Using LastItemID as a Popup ID won't conflict!
        IM_ASSERT(id != 0);                                                  // You cannot pass a NULL str_id if the last item has no identifier (e.g. a Text() item)
        OpenPopupEx(id);
        return true;
    }
    return false;
}